

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O1

bool __thiscall xercesc_4_0::DTDScanner::getQuotedString(DTDScanner *this,XMLBuffer *toFill)

{
  XMLSize_t XVar1;
  bool bVar2;
  XMLCh XVar3;
  XMLCh quoteCh;
  XMLCh local_1a;
  
  toFill->fIndex = 0;
  bVar2 = ReaderMgr::skipIfQuote(this->fReaderMgr,&local_1a);
  if (bVar2) {
    XVar3 = ReaderMgr::getNextChar(this->fReaderMgr);
    bVar2 = XVar3 == local_1a;
    if (XVar3 != L'\0' && !bVar2) {
      do {
        if (toFill->fIndex == toFill->fCapacity) {
          XMLBuffer::ensureCapacity(toFill,1);
        }
        XVar1 = toFill->fIndex;
        toFill->fIndex = XVar1 + 1;
        toFill->fBuffer[XVar1] = XVar3;
        XVar3 = ReaderMgr::getNextChar(this->fReaderMgr);
        bVar2 = XVar3 == local_1a;
      } while ((XVar3 != L'\0') && (XVar3 != local_1a));
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool DTDScanner::getQuotedString(XMLBuffer& toFill)
{
    // Reset the target buffer
    toFill.reset();

    // Get the next char which must be a single or double quote
    XMLCh quoteCh;
    if (!fReaderMgr->skipIfQuote(quoteCh))
        return false;

	XMLCh nextCh;
    // Get another char and see if it matches the starting quote char
    while ((nextCh=fReaderMgr->getNextChar())!=quoteCh)
    {
        //
        //  We should never get either an end of file null char here. If we
        //  do, just fail. It will be handled more gracefully in the higher
        //  level code that called us.
        //
        if (!nextCh)
            return false;

        // Else add it to the buffer
        toFill.append(nextCh);
    }
    return true;
}